

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  StkId pSVar1;
  TValue *fi;
  char *pcVar2;
  TValue *val;
  TValue *local_20;
  
  local_20 = (TValue *)0x0;
  fi = index2value(L,funcindex);
  pcVar2 = aux_upvalue(fi,n,&local_20,(GCObject **)0x0);
  if (pcVar2 != (char *)0x0) {
    pSVar1 = (L->top).p;
    (pSVar1->val).value_ = local_20->value_;
    (pSVar1->val).tt_ = local_20->tt_;
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_getupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  lua_lock(L);
  name = aux_upvalue(index2value(L, funcindex), n, &val, NULL);
  if (name) {
    setobj2s(L, L->top.p, val);
    api_incr_top(L);
  }
  lua_unlock(L);
  return name;
}